

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O3

int yang_print_model_(lyout *out,int level,lys_module *module)

{
  lys_ext *plVar1;
  lys_feature *plVar2;
  lys_deviation *plVar3;
  byte bVar4;
  int iVar5;
  uint ext_size;
  int extraout_EAX;
  lys_import *plVar6;
  lys_include *plVar7;
  lys_module *plVar8;
  lys_module *plVar9;
  lys_deviate *plVar10;
  lys_ext_instance **pplVar11;
  long lVar12;
  char *pcVar13;
  lys_deviate *plVar14;
  lyout *plVar15;
  int iVar16;
  uint uVar17;
  lys_node *plVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  int local_64;
  int iStack_60;
  int flag_1;
  int flag;
  ulong local_50;
  lys_module *local_48;
  ulong local_40;
  lyout *local_38;
  
  pcVar13 = "";
  if ((module->field_0x40 & 0x30) == 0x10) {
    pcVar13 = " // DEVIATED";
  }
  uVar17 = level + 1;
  _flag = (ulong)uVar17;
  local_38 = out;
  if ((module->field_0x40 & 1) == 0) {
    ly_print(out,"%*smodule %s {%s\n",(ulong)(uint)(level * 2),"",module->name,pcVar13);
    bVar4 = (byte)module->field_0x40 >> 1 & 7;
    if (bVar4 != 0) {
      pcVar13 = "1";
      if (bVar4 == 2) {
        pcVar13 = "1.1";
      }
      yang_print_substmt(out,uVar17,LYEXT_SUBSTMT_VERSION,'\0',pcVar13,module,module->ext,
                         (uint)module->ext_size);
    }
    yang_print_substmt(out,uVar17,LYEXT_SUBSTMT_NAMESPACE,'\0',module->ns,module,module->ext,
                       (uint)module->ext_size);
    yang_print_substmt(out,uVar17,LYEXT_SUBSTMT_PREFIX,'\0',module->prefix,module,module->ext,
                       (uint)module->ext_size);
  }
  else {
    ly_print(out,"%*ssubmodule %s {%s\n",(ulong)(uint)(level * 2),"",module->name,pcVar13);
    plVar8 = lys_main_module(module);
    if (((plVar8->field_0x40 & 0xc) != 0) ||
       (iVar16 = lys_ext_iter(module->ext,module->ext_size,'\0',LYEXT_SUBSTMT_VERSION), iVar16 != -1
       )) {
      pcVar13 = "1";
      if (((ulong)module->data->parent & 0xe) == 4) {
        pcVar13 = "1.1";
      }
      yang_print_substmt(out,uVar17,LYEXT_SUBSTMT_VERSION,'\0',pcVar13,module,module->ext,
                         (uint)module->ext_size);
    }
    ly_print(out,"%*sbelongs-to %s {\n",(ulong)(uVar17 * 2),"");
    iVar16 = lys_ext_iter(module->ext,module->ext_size,'\0',LYEXT_SUBSTMT_BELONGSTO);
    for (; iVar16 != -1;
        iVar16 = lys_ext_iter(module->ext,module->ext_size,(char)iVar16 + '\x01',
                              LYEXT_SUBSTMT_BELONGSTO)) {
      yang_print_extension_instances
                (out,level + 2,module,LYEXT_SUBSTMT_BELONGSTO,'\0',module->ext + iVar16,1);
    }
    yang_print_substmt(out,level + 2,LYEXT_SUBSTMT_PREFIX,'\0',module->prefix,module,module->ext,
                       (uint)module->ext_size);
    ly_print(out,"%*s}\n",(ulong)(uVar17 * 2));
  }
  plVar15 = local_38;
  if (module->imp_size != '\0') {
    uVar17 = (int)_flag * 2;
    local_40 = CONCAT44(local_40._4_4_,level + 2);
    lVar12 = 0;
    uVar20 = 0;
    do {
      ly_print(plVar15,"\n%*simport %s {\n",(ulong)uVar17);
      iVar16 = (int)local_40;
      yang_print_extension_instances
                (plVar15,(int)local_40,module,LYEXT_SUBSTMT_SELF,'\0',
                 *(lys_ext_instance ***)(module->imp->rev + lVar12 + 0x10),
                 (uint)(byte)module->imp->rev[lVar12 + 0xb]);
      plVar6 = module->imp;
      yang_print_substmt(plVar15,iVar16,LYEXT_SUBSTMT_PREFIX,'\0',
                         *(char **)(plVar6->rev + lVar12 + -8),module,
                         *(lys_ext_instance ***)(plVar6->rev + lVar12 + 0x10),
                         (uint)(byte)plVar6->rev[lVar12 + 0xb]);
      plVar6 = module->imp;
      local_50 = uVar20;
      if (plVar6->rev[lVar12] != '\0') {
        yang_print_substmt(plVar15,(int)local_40,LYEXT_SUBSTMT_REVISIONDATE,'\0',
                           plVar6->rev + lVar12,module,
                           *(lys_ext_instance ***)(plVar6->rev + lVar12 + 0x10),
                           (uint)(byte)plVar6->rev[lVar12 + 0xb]);
        plVar6 = module->imp;
      }
      iVar16 = (int)local_40;
      yang_print_substmt(plVar15,(int)local_40,LYEXT_SUBSTMT_DESCRIPTION,'\0',
                         *(char **)(plVar6->rev + lVar12 + 0x18),module,
                         *(lys_ext_instance ***)(plVar6->rev + lVar12 + 0x10),
                         (uint)(byte)plVar6->rev[lVar12 + 0xb]);
      plVar6 = module->imp;
      yang_print_substmt(plVar15,iVar16,LYEXT_SUBSTMT_REFERENCE,'\0',
                         *(char **)(plVar6->rev + lVar12 + 0x20),module,
                         *(lys_ext_instance ***)(plVar6->rev + lVar12 + 0x10),
                         (uint)(byte)plVar6->rev[lVar12 + 0xb]);
      ly_print(plVar15,"%*s}\n",uVar17);
      uVar20 = local_50 + 1;
      lVar12 = lVar12 + 0x38;
    } while (uVar20 < module->imp_size);
  }
  plVar15 = local_38;
  if (module->inc_size != '\0') {
    local_40 = CONCAT44(local_40._4_4_,(int)_flag * 2);
    iVar16 = level + 2;
    lVar12 = 0x18;
    uVar20 = 0;
    do {
      plVar7 = module->inc;
      if ((((plVar7->rev[lVar12 + -0x18] == '\0') && (*(long *)(plVar7->rev + lVar12) == 0)) &&
          (*(long *)(plVar7->rev + lVar12 + 8) == 0)) && (plVar7->rev[lVar12 + -0xd] == '\0')) {
        ly_print(local_38,"\n%*sinclude \"%s\";\n",local_40 & 0xffffffff);
      }
      else {
        ly_print(plVar15,"\n%*sinclude %s {\n",local_40 & 0xffffffff);
        yang_print_extension_instances
                  (plVar15,iVar16,module,LYEXT_SUBSTMT_SELF,'\0',
                   *(lys_ext_instance ***)(module->inc->rev + lVar12 + -8),
                   (uint)(byte)module->inc->rev[lVar12 + -0xd]);
        plVar7 = module->inc;
        if (plVar7->rev[lVar12 + -0x18] != '\0') {
          pcVar13 = plVar7->rev + lVar12 + -8;
          yang_print_substmt(plVar15,iVar16,LYEXT_SUBSTMT_REVISIONDATE,'\0',pcVar13 + -0x10,module,
                             *(lys_ext_instance ***)pcVar13,(uint)(byte)pcVar13[-5]);
          plVar7 = module->inc;
        }
        yang_print_substmt(plVar15,iVar16,LYEXT_SUBSTMT_DESCRIPTION,'\0',
                           *(char **)(plVar7->rev + lVar12),module,
                           *(lys_ext_instance ***)(plVar7->rev + lVar12 + -8),
                           (uint)(byte)plVar7->rev[lVar12 + -0xd]);
        plVar7 = module->inc;
        yang_print_substmt(plVar15,iVar16,LYEXT_SUBSTMT_REFERENCE,'\0',
                           *(char **)(plVar7->rev + lVar12 + 8),module,
                           *(lys_ext_instance ***)(plVar7->rev + lVar12 + -8),
                           (uint)(byte)plVar7->rev[lVar12 + -0xd]);
        ly_print(plVar15,"%*s}\n",local_40 & 0xffffffff);
      }
      uVar20 = uVar20 + 1;
      lVar12 = lVar12 + 0x30;
    } while (uVar20 < module->inc_size);
  }
  plVar15 = local_38;
  if (((module->org == (char *)0x0) && (module->contact == (char *)0x0)) &&
     ((module->dsc == (char *)0x0 && (module->ref == (char *)0x0)))) {
    pcVar13 = (char *)0x0;
  }
  else {
    ly_print(local_38,"\n");
    pcVar13 = module->org;
  }
  iVar16 = (int)_flag;
  yang_print_substmt(plVar15,iVar16,LYEXT_SUBSTMT_ORGANIZATION,'\0',pcVar13,module,module->ext,
                     (uint)module->ext_size);
  yang_print_substmt(plVar15,iVar16,LYEXT_SUBSTMT_CONTACT,'\0',module->contact,module,module->ext,
                     (uint)module->ext_size);
  yang_print_substmt(plVar15,iVar16,LYEXT_SUBSTMT_DESCRIPTION,'\0',module->dsc,module,module->ext,
                     (uint)module->ext_size);
  yang_print_substmt(plVar15,iVar16,LYEXT_SUBSTMT_REFERENCE,'\0',module->ref,module,module->ext,
                     (uint)module->ext_size);
  if ((module->rev_size != '\0') && (ly_print(plVar15,"\n"), module->rev_size != '\0')) {
    lVar12 = 0;
    uVar20 = 0;
    do {
      yang_print_revision(plVar15,iVar16,module,(lys_revision *)(module->rev->date + lVar12));
      uVar20 = uVar20 + 1;
      lVar12 = lVar12 + 0x28;
    } while (uVar20 < module->rev_size);
  }
  local_48 = module;
  if (module->extensions_size != '\0') {
    uVar17 = iVar16 * 2;
    local_40 = CONCAT44(local_40._4_4_,level + 3);
    uVar20 = 0;
    local_50 = CONCAT44(local_50._4_4_,level + 2);
    do {
      plVar8 = local_48;
      ly_print(plVar15,"\n");
      plVar1 = plVar8->extensions;
      plVar18 = (lys_node *)(plVar1 + uVar20);
      iStack_60 = 0;
      ly_print(plVar15,"%*sextension %s",(ulong)uVar17,"",plVar1[uVar20].name);
      yang_print_snode_common
                (plVar15,(int)local_50,plVar18,plVar1[uVar20].module,&stack0xffffffffffffffa0,1);
      iVar16 = (int)local_50;
      if (plVar1[uVar20].argument != (char *)0x0) {
        if (iStack_60 == 0) {
          iStack_60 = 1;
          ly_print(local_38," {\n");
        }
        iVar5 = 0;
        ly_print(local_38,"%*sargument %s",level * 2 + 4,"");
        iVar16 = lys_ext_iter(plVar18->ext,plVar18->ext_size,'\0',LYEXT_SUBSTMT_ARGUMENT);
        if (iVar16 != -1) {
          iVar5 = 0;
          do {
            if (iVar5 == 0) {
              ly_print(local_38," {\n");
              iVar5 = 1;
            }
            yang_print_extension_instances
                      (local_38,(int)local_40,plVar18->module,LYEXT_SUBSTMT_ARGUMENT,'\0',
                       plVar18->ext + iVar16,1);
            iVar16 = lys_ext_iter(plVar18->ext,plVar18->ext_size,(char)iVar16 + '\x01',
                                  LYEXT_SUBSTMT_ARGUMENT);
          } while (iVar16 != -1);
        }
        if (((plVar18->flags & 1) == 0) &&
           (iVar16 = lys_ext_iter(plVar18->ext,plVar18->ext_size,'\0',LYEXT_SUBSTMT_YINELEM),
           iVar16 == -1)) {
          plVar15 = local_38;
          iVar16 = (int)local_50;
        }
        else {
          iVar16 = (int)local_50;
          if (iVar5 == 0) {
            ly_print(local_38," {\n");
            iVar5 = 1;
          }
          plVar15 = local_38;
          pcVar13 = "true";
          if ((plVar18->flags & 1) == 0) {
            pcVar13 = "false";
          }
          yang_print_substmt(local_38,(int)local_40,LYEXT_SUBSTMT_YINELEM,'\0',pcVar13,
                             plVar18->module,plVar18->ext,(uint)plVar18->ext_size);
        }
        yang_print_close(plVar15,iVar16,iVar5);
      }
      yang_print_snode_common(plVar15,iVar16,plVar18,plVar18->module,&stack0xffffffffffffffa0,0x70);
      iVar16 = (int)_flag;
      yang_print_close(plVar15,iVar16,iStack_60);
      uVar20 = uVar20 + 1;
    } while (uVar20 < local_48->extensions_size);
  }
  plVar8 = local_48;
  if (local_48->ext_size != '\0') {
    ly_print(plVar15,"\n");
    yang_print_extension_instances
              (plVar15,iVar16,plVar8,LYEXT_SUBSTMT_SELF,'\0',plVar8->ext,(uint)plVar8->ext_size);
  }
  if (plVar8->features_size != '\0') {
    local_40 = CONCAT44(local_40._4_4_,iVar16 * 2);
    local_50 = CONCAT44(local_50._4_4_,level + 2);
    lVar12 = 0;
    uVar20 = 0;
    do {
      ly_print(plVar15,"\n");
      plVar2 = plVar8->features;
      iStack_60 = 0;
      ly_print(local_38,"%*sfeature %s",local_40 & 0xffffffff,"",
               *(undefined8 *)(plVar2->padding + lVar12 + -0x1c));
      plVar15 = local_38;
      yang_print_snode_common
                (local_38,(int)local_50,(lys_node *)(plVar2->padding + lVar12 + -0x1c),
                 *(lys_module **)(plVar2->padding + lVar12 + 0x14),&stack0xffffffffffffffa0,0x73);
      yang_print_close(plVar15,(int)_flag,iStack_60);
      uVar20 = uVar20 + 1;
      lVar12 = lVar12 + 0x40;
    } while (uVar20 < plVar8->features_size);
  }
  if (plVar8->ident_size != 0) {
    local_50 = CONCAT44(local_50._4_4_,(int)_flag * 2);
    iVar16 = level + 2;
    uVar20 = 0;
    do {
      ly_print(plVar15,"\n");
      plVar18 = (lys_node *)(plVar8->ident + uVar20);
      local_64 = 0;
      local_40 = uVar20;
      ly_print(plVar15,"%*sidentity %s",local_50 & 0xffffffff,"",plVar18->name);
      yang_print_snode_common(plVar15,iVar16,plVar18,plVar18->module,&local_64,3);
      if (plVar18->padding[3] != '\0') {
        uVar20 = 0;
        do {
          if (local_64 == 0) {
            local_64 = 1;
            ly_print(local_38," {\n");
          }
          plVar8 = lys_main_module(*(lys_module **)
                                    (*(long *)(*(long *)&plVar18->nodetype + uVar20 * 8) + 0x30));
          plVar9 = lys_main_module(plVar18->module);
          if (plVar9 == plVar8) {
            yang_print_substmt(local_38,iVar16,LYEXT_SUBSTMT_BASE,(uint8_t)uVar20,
                               (char *)**(undefined8 **)(*(long *)&plVar18->nodetype + uVar20 * 8),
                               plVar18->module,plVar18->ext,(uint)plVar18->ext_size);
          }
          else {
            pcVar13 = transform_module_name2import_prefix(plVar18->module,plVar8->name);
            asprintf((char **)&stack0xffffffffffffffa0,"%s:%s",pcVar13,
                     **(undefined8 **)(*(long *)&plVar18->nodetype + uVar20 * 8));
            yang_print_substmt(local_38,iVar16,LYEXT_SUBSTMT_BASE,(uint8_t)uVar20,
                               (char *)CONCAT44(flag_1,iStack_60),plVar18->module,plVar18->ext,
                               (uint)plVar18->ext_size);
            free((void *)CONCAT44(flag_1,iStack_60));
          }
          uVar20 = uVar20 + 1;
          plVar8 = local_48;
        } while (uVar20 < plVar18->padding[3]);
      }
      plVar15 = local_38;
      yang_print_snode_common(local_38,iVar16,plVar18,plVar18->module,&local_64,0x70);
      yang_print_close(plVar15,(int)_flag,local_64);
      uVar20 = local_40 + 1;
    } while (uVar20 < plVar8->ident_size);
  }
  iVar16 = (int)_flag;
  if (plVar8->tpdf_size != '\0') {
    lVar12 = 0;
    uVar20 = 0;
    do {
      ly_print(plVar15,"\n");
      yang_print_typedef(plVar15,iVar16,plVar8,(lys_tpdf *)(plVar8->tpdf->padding + lVar12 + -0x1c))
      ;
      uVar20 = uVar20 + 1;
      lVar12 = lVar12 + 0x80;
    } while (uVar20 < plVar8->tpdf_size);
  }
  plVar9 = lys_main_module(plVar8);
  for (plVar18 = plVar9->data; plVar18 != (lys_node *)0x0; plVar18 = plVar18->next) {
    if (plVar18->module == plVar8) {
      yang_print_snode(local_38,iVar16,plVar18,0x800);
    }
  }
  plVar9 = lys_main_module(plVar8);
  for (plVar18 = plVar9->data; plVar15 = local_38, plVar18 != (lys_node *)0x0;
      plVar18 = plVar18->next) {
    if (plVar18->module == plVar8) {
      yang_print_snode(local_38,iVar16,plVar18,0x903f);
    }
  }
  if (plVar8->augment_size != '\0') {
    lVar12 = 0;
    uVar20 = 0;
    do {
      ly_print(plVar15,"\n");
      yang_print_augment(plVar15,iVar16,
                         (lys_node_augment *)(plVar8->augment->padding + lVar12 + -0x1c));
      uVar20 = uVar20 + 1;
      lVar12 = lVar12 + 0x68;
    } while (uVar20 < plVar8->augment_size);
  }
  plVar9 = lys_main_module(plVar8);
  for (plVar18 = plVar9->data; plVar18 != (lys_node *)0x0; plVar18 = plVar18->next) {
    if (plVar18->module == plVar8) {
      yang_print_snode(local_38,iVar16,plVar18,0x4100);
    }
  }
  plVar9 = lys_main_module(plVar8);
  for (plVar18 = plVar9->data; plVar18 != (lys_node *)0x0; plVar18 = plVar18->next) {
    if (plVar18->module == plVar8) {
      yang_print_snode(local_38,iVar16,plVar18,0x80);
    }
  }
  if (plVar8->deviation_size == '\0') {
    iVar16 = iVar16 * 2;
    plVar15 = local_38;
  }
  else {
    uVar20 = (ulong)(uint)(iVar16 * 2);
    iVar5 = level + 2;
    uVar17 = level * 2 + 4;
    local_50 = CONCAT44(local_50._4_4_,level * 2 + 6);
    uVar21 = 0;
    local_40 = CONCAT44(local_40._4_4_,level + 3);
    plVar15 = local_38;
    _flag = uVar20;
    do {
      ly_print(plVar15,"\n");
      plVar3 = plVar8->deviation;
      pcVar13 = transform_json2schema(plVar8,plVar3[uVar21].target_name);
      ly_print(local_38,"%*sdeviation \"%s\" {\n",uVar20 & 0xffffffff);
      plVar8 = local_48;
      lydict_remove(local_48->ctx,pcVar13);
      plVar15 = local_38;
      ext_size = 0;
      if (plVar3[uVar21].ext_size != 0) {
        yang_print_extension_instances
                  (local_38,iVar5,plVar8,LYEXT_SUBSTMT_SELF,'\0',plVar3[uVar21].ext,
                   (uint)plVar3[uVar21].ext_size);
        ext_size = (uint)plVar3[uVar21].ext_size;
      }
      yang_print_substmt(plVar15,iVar5,LYEXT_SUBSTMT_DESCRIPTION,'\0',plVar3[uVar21].dsc,plVar8,
                         plVar3[uVar21].ext,ext_size);
      yang_print_substmt(plVar15,iVar5,LYEXT_SUBSTMT_REFERENCE,'\0',plVar3[uVar21].ref,plVar8,
                         plVar3[uVar21].ext,(uint)plVar3[uVar21].ext_size);
      if (plVar3[uVar21].deviate_size != '\0') {
        uVar20 = 0;
        iVar16 = (int)local_40;
        do {
          ly_print(plVar15,"%*sdeviate ",(ulong)uVar17,"");
          pcVar13 = "add {\n";
          switch(plVar3[uVar21].deviate[uVar20].mod) {
          case LY_DEVIATE_NO:
            pcVar13 = "not-supported {\n";
            if (plVar3[uVar21].deviate[uVar20].ext_size != '\0') break;
            ly_print(plVar15,"not-supported;\n");
            goto LAB_001727ad;
          case LY_DEVIATE_ADD:
            break;
          case LY_DEVIATE_RPL:
            pcVar13 = "replace {\n";
            break;
          case LY_DEVIATE_DEL:
            pcVar13 = "delete {\n";
            break;
          default:
            goto switchD_001723c3_default;
          }
          ly_print(plVar15,pcVar13);
switchD_001723c3_default:
          plVar8 = local_48;
          plVar10 = plVar3[uVar21].deviate;
          if (plVar10[uVar20].ext_size != 0) {
            yang_print_extension_instances
                      (plVar15,iVar16,local_48,LYEXT_SUBSTMT_SELF,'\0',plVar10[uVar20].ext,
                       (uint)plVar10[uVar20].ext_size);
            plVar10 = plVar3[uVar21].deviate;
          }
          if (plVar10[uVar20].type != (lys_type *)0x0) {
            yang_print_type(plVar15,iVar16,plVar8,plVar10[uVar20].type);
            plVar10 = plVar3[uVar21].deviate;
          }
          yang_print_substmt(plVar15,iVar16,LYEXT_SUBSTMT_UNITS,'\0',plVar10[uVar20].units,plVar8,
                             plVar10[uVar20].ext,(uint)plVar10[uVar20].ext_size);
          plVar10 = plVar3[uVar21].deviate;
          if (plVar10[uVar20].must_size != '\0') {
            lVar12 = 0;
            uVar19 = 0;
            do {
              yang_print_must(local_38,(int)local_40,local_48,
                              (lys_restr *)((long)&(plVar10[uVar20].must)->expr + lVar12));
              uVar19 = uVar19 + 1;
              plVar10 = plVar3[uVar21].deviate;
              lVar12 = lVar12 + 0x38;
            } while (uVar19 < plVar10[uVar20].must_size);
          }
          plVar15 = local_38;
          if (plVar10[uVar20].unique_size != '\0') {
            uVar19 = 0;
            do {
              yang_print_unique(plVar15,(int)local_40,plVar10[uVar20].unique + uVar19);
              plVar10 = plVar3[uVar21].deviate;
              iVar16 = -1;
              while (iVar16 = lys_ext_iter(plVar10[uVar20].ext,plVar10[uVar20].ext_size,
                                           (char)iVar16 + '\x01',LYEXT_SUBSTMT_UNIQUE), iVar16 != -1
                    ) {
                plVar10 = plVar3[uVar21].deviate;
                if (uVar19 == plVar10[uVar20].ext[iVar16]->insubstmt_index) {
                  ly_print(plVar15," {\n");
                  pplVar11 = plVar3[uVar21].deviate[uVar20].ext;
                  do {
                    yang_print_extension_instances
                              (plVar15,level + 4,local_48,LYEXT_SUBSTMT_UNIQUE,(uint8_t)uVar19,
                               pplVar11 + iVar16,1);
                    plVar10 = plVar3[uVar21].deviate;
                    do {
                      iVar16 = lys_ext_iter(plVar10[uVar20].ext,plVar10[uVar20].ext_size,
                                            (char)iVar16 + '\x01',LYEXT_SUBSTMT_UNIQUE);
                      if (iVar16 == -1) {
                        ly_print(plVar15,"%*s}\n",local_50 & 0xffffffff,"");
                        goto LAB_00172602;
                      }
                      plVar10 = plVar3[uVar21].deviate;
                      pplVar11 = plVar10[uVar20].ext;
                    } while (uVar19 != pplVar11[iVar16]->insubstmt_index);
                  } while( true );
                }
              }
              ly_print(plVar15,";\n");
LAB_00172602:
              uVar19 = uVar19 + 1;
              plVar10 = plVar3[uVar21].deviate;
            } while (uVar19 < plVar10[uVar20].unique_size);
          }
          plVar8 = local_48;
          plVar14 = plVar10 + uVar20;
          if (plVar14->dflt_size != '\0') {
            uVar19 = 0;
            do {
              yang_print_substmt(plVar15,(int)local_40,LYEXT_SUBSTMT_DEFAULT,(uint8_t)uVar19,
                                 plVar14->dflt[uVar19],plVar8,plVar14->ext,(uint)plVar14->ext_size);
              uVar19 = uVar19 + 1;
              plVar10 = plVar3[uVar21].deviate;
              plVar14 = plVar10 + uVar20;
            } while (uVar19 < plVar14->dflt_size);
          }
          pcVar13 = "true";
          iVar16 = (int)local_40;
          if (((plVar14->flags & 1) != 0) || (pcVar13 = "false", (plVar14->flags & 2) != 0)) {
            yang_print_substmt(plVar15,(int)local_40,LYEXT_SUBSTMT_CONFIG,'\0',pcVar13,local_48,
                               plVar10->ext,(uint)plVar14->ext_size);
          }
          plVar10 = plVar3[uVar21].deviate;
          pcVar13 = "true";
          if (((plVar10[uVar20].flags & 0x40) != 0) ||
             (pcVar13 = "false", (char)plVar10[uVar20].flags < '\0')) {
            yang_print_substmt(plVar15,iVar16,LYEXT_SUBSTMT_MANDATORY,'\0',pcVar13,local_48,
                               plVar10[uVar20].ext,(uint)plVar10[uVar20].ext_size);
          }
          plVar10 = plVar3[uVar21].deviate;
          if (plVar10[uVar20].min_set != '\0') {
            yang_print_unsigned(plVar15,iVar16,LYEXT_SUBSTMT_MIN,'\0',local_48,plVar10[uVar20].ext,
                                (uint)plVar10[uVar20].ext_size,plVar10[uVar20].min);
            plVar10 = plVar3[uVar21].deviate;
          }
          if (plVar10[uVar20].max_set != '\0') {
            if (plVar10[uVar20].max == 0) {
              yang_print_substmt(plVar15,iVar16,LYEXT_SUBSTMT_MAX,'\0',"unbounded",local_48,
                                 plVar10[uVar20].ext,(uint)plVar10[uVar20].ext_size);
            }
            else {
              yang_print_unsigned(plVar15,iVar16,LYEXT_SUBSTMT_MAX,'\0',local_48,plVar10[uVar20].ext
                                  ,(uint)plVar10[uVar20].ext_size,plVar10[uVar20].max);
            }
          }
          ly_print(plVar15,"%*s}\n",(ulong)uVar17,"");
LAB_001727ad:
          uVar20 = uVar20 + 1;
        } while (uVar20 < plVar3[uVar21].deviate_size);
      }
      uVar20 = _flag;
      iVar16 = (int)_flag;
      ly_print(plVar15,"%*s}\n",_flag & 0xffffffff,"");
      uVar21 = uVar21 + 1;
      plVar8 = local_48;
    } while (uVar21 < local_48->deviation_size);
  }
  ly_print(plVar15,"%*s}\n",(ulong)(iVar16 - 2),"");
  ly_print_flush(plVar15);
  return extraout_EAX;
}

Assistant:

static int
yang_print_model_(struct lyout *out, int level, const struct lys_module *module)
{
    unsigned int i;
    int p;

    struct lys_node *node;

    /* (sub)module-header-stmts */
    if (module->type) {
        ly_print(out, "%*ssubmodule %s {%s\n", LEVEL, INDENT, module->name,
                 (module->deviated == 1 ? " // DEVIATED" : ""));
        level++;
        if (lys_main_module(module)->version > 1 ||
                lys_ext_iter(module->ext, module->ext_size, 0, LYEXT_SUBSTMT_VERSION) != -1) {
            yang_print_substmt(out, level, LYEXT_SUBSTMT_VERSION, 0,
                               ((struct lys_submodule *)module)->belongsto->version == 2 ? "1.1" : "1",
                               module, module->ext, module->ext_size);
        }
        ly_print(out, "%*sbelongs-to %s {\n", LEVEL, INDENT, ((struct lys_submodule *)module)->belongsto->name);
        p = -1;
        while ((p = lys_ext_iter(module->ext, module->ext_size, p + 1, LYEXT_SUBSTMT_BELONGSTO)) != -1) {
            yang_print_extension_instances(out, level + 1, module, LYEXT_SUBSTMT_BELONGSTO, 0, &module->ext[p], 1);
        }
        yang_print_substmt(out, level + 1, LYEXT_SUBSTMT_PREFIX, 0, module->prefix,
                           module, module->ext, module->ext_size);
        ly_print(out, "%*s}\n", LEVEL, INDENT);
    } else {
        ly_print(out, "%*smodule %s {%s\n", LEVEL, INDENT, module->name,
                 (module->deviated == 1 ? " // DEVIATED" : ""));
        level++;
        if (module->version) {
            yang_print_substmt(out, level, LYEXT_SUBSTMT_VERSION, 0, module->version == 2 ? "1.1" : "1",
                               module, module->ext, module->ext_size);
        }
        yang_print_substmt(out, level, LYEXT_SUBSTMT_NAMESPACE, 0, module->ns,
                           module, module->ext, module->ext_size);
        yang_print_substmt(out, level, LYEXT_SUBSTMT_PREFIX, 0, module->prefix,
                           module, module->ext, module->ext_size);
    }

    /* linkage-stmts */
    for (i = 0; i < module->imp_size; i++) {
        ly_print(out, "\n%*simport %s {\n", LEVEL, INDENT, module->imp[i].module->name);
        level++;
        yang_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0,
                                       module->imp[i].ext, module->imp[i].ext_size);
        yang_print_substmt(out, level, LYEXT_SUBSTMT_PREFIX, 0, module->imp[i].prefix,
                           module, module->imp[i].ext, module->imp[i].ext_size);
        if (module->imp[i].rev[0]) {
            yang_print_substmt(out, level, LYEXT_SUBSTMT_REVISIONDATE, 0, module->imp[i].rev,
                               module, module->imp[i].ext, module->imp[i].ext_size);
        }
        yang_print_substmt(out, level, LYEXT_SUBSTMT_DESCRIPTION, 0, module->imp[i].dsc,
                           module, module->imp[i].ext, module->imp[i].ext_size);
        yang_print_substmt(out, level, LYEXT_SUBSTMT_REFERENCE, 0, module->imp[i].ref,
                           module, module->imp[i].ext, module->imp[i].ext_size);
        level--;
        ly_print(out, "%*s}\n", LEVEL, INDENT);
    }
    for (i = 0; i < module->inc_size; i++) {
        if (module->inc[i].rev[0] || module->inc[i].dsc || module->inc[i].ref || module->inc[i].ext_size) {
            ly_print(out, "\n%*sinclude %s {\n", LEVEL, INDENT, module->inc[i].submodule->name);
            level++;
            yang_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0,
                                           module->inc[i].ext, module->inc[i].ext_size);
            if (module->inc[i].rev[0]) {
                yang_print_substmt(out, level, LYEXT_SUBSTMT_REVISIONDATE, 0, module->inc[i].rev,
                                   module, module->inc[i].ext, module->inc[i].ext_size);
            }
            yang_print_substmt(out, level, LYEXT_SUBSTMT_DESCRIPTION, 0, module->inc[i].dsc,
                               module, module->inc[i].ext, module->inc[i].ext_size);
            yang_print_substmt(out, level, LYEXT_SUBSTMT_REFERENCE, 0, module->inc[i].ref,
                               module, module->inc[i].ext, module->inc[i].ext_size);
            level--;
            ly_print(out, "%*s}\n", LEVEL, INDENT);
        } else {
            ly_print(out, "\n%*sinclude \"%s\";\n", LEVEL, INDENT, module->inc[i].submodule->name);
        }
    }

    /* meta-stmts */
    if (module->org || module->contact || module->dsc || module->ref) {
        ly_print(out, "\n");
    }
    yang_print_substmt(out, level, LYEXT_SUBSTMT_ORGANIZATION, 0, module->org,
                       module, module->ext, module->ext_size);
    yang_print_substmt(out, level, LYEXT_SUBSTMT_CONTACT, 0, module->contact,
                       module, module->ext, module->ext_size);
    yang_print_substmt(out, level, LYEXT_SUBSTMT_DESCRIPTION, 0, module->dsc,
                       module, module->ext, module->ext_size);
    yang_print_substmt(out, level, LYEXT_SUBSTMT_REFERENCE, 0, module->ref,
                       module, module->ext, module->ext_size);

    /* revision-stmts */
    if (module->rev_size) {
        ly_print(out, "\n");
    }
    for (i = 0; i < module->rev_size; i++) {
        yang_print_revision(out, level, module, &module->rev[i]);
    }

    /* body-stmts */
    for (i = 0; i < module->extensions_size; i++) {
        ly_print(out, "\n");
        yang_print_extension(out, level, &module->extensions[i]);
    }
    if (module->ext_size) {
        ly_print(out, "\n");
        yang_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0, module->ext, module->ext_size);
    }

    for (i = 0; i < module->features_size; i++) {
        ly_print(out, "\n");
        yang_print_feature(out, level, &module->features[i]);
    }

    for (i = 0; i < module->ident_size; i++) {
        ly_print(out, "\n");
        yang_print_identity(out, level, &module->ident[i]);
    }

    for (i = 0; i < module->tpdf_size; i++) {
        ly_print(out, "\n");
        yang_print_typedef(out, level, module, &module->tpdf[i]);
    }

    LY_TREE_FOR(lys_main_module(module)->data, node) {
        if (node->module != module) {
            /* data from submodules */
            continue;
        }
        yang_print_snode(out, level, node, LYS_GROUPING);
    }

    LY_TREE_FOR(lys_main_module(module)->data, node) {
        if (node->module != module) {
            /* data from submodules */
            continue;
        }
        yang_print_snode(out, level, node, LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST |
                             LYS_USES | LYS_ANYDATA);
    }

    for (i = 0; i < module->augment_size; i++) {
        ly_print(out, "\n");
        yang_print_augment(out, level, &module->augment[i]);
    }

    LY_TREE_FOR(lys_main_module(module)->data, node) {
        if (node->module != module) {
            /* data from submodules */
            continue;
        }
        yang_print_snode(out, level, node, LYS_RPC | LYS_ACTION);
    }

    LY_TREE_FOR(lys_main_module(module)->data, node) {
        if (node->module != module) {
            /* data from submodules */
            continue;
        }
        yang_print_snode(out, level, node, LYS_NOTIF);
    }

    for (i = 0; i < module->deviation_size; ++i) {
        ly_print(out, "\n");
        yang_print_deviation(out, level, module, &module->deviation[i]);
    }

    level--;
    ly_print(out, "%*s}\n", LEVEL, INDENT);
    ly_print_flush(out);

    return EXIT_SUCCESS;
}